

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase367::run(TestCase367 *this)

{
  ArrayPtr<const_capnp::word> other;
  word *pwVar1;
  size_t sVar2;
  bool bVar3;
  size_t in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  Array<capnp::word> serialized;
  TestOutputStream output;
  TestMessageBuilder builder;
  Array<capnp::word> local_178;
  TestOutputStream local_158;
  StructBuilder local_128;
  undefined **local_100;
  StructBuilder in_stack_ffffffffffffff70;
  
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)&local_100,0,FIXED_SIZE);
  local_100 = &PTR__TestMessageBuilder_0036d5d0;
  MessageBuilder::getRootInternal((Builder *)&local_178,(MessageBuilder *)&local_100);
  local_158.data._M_string_length = (size_type)local_178.disposer;
  local_158.super_OutputStream._vptr_OutputStream = (_func_int **)local_178.ptr;
  local_158.data._M_dataplus._M_p = (pointer)local_178.size_;
  PointerBuilder::initStruct(&local_128,(PointerBuilder *)&local_158,(StructSize)0x140006);
  initTestMessage((Builder)in_stack_ffffffffffffff70);
  AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  segments.ptr = (ArrayPtr<const_capnp::word> *)AVar5.size_;
  segments.size_ = in_RCX;
  messageToFlatArray(&local_178,(capnp *)AVar5.ptr,segments);
  paVar4 = &local_158.data.field_2;
  local_158.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__TestOutputStream_0036d868;
  local_158.data._M_string_length = 0;
  local_158.data.field_2._M_local_buf[0] = '\0';
  local_158.data._M_dataplus._M_p = (pointer)paVar4;
  AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  segments_00.ptr = (ArrayPtr<const_capnp::word> *)AVar5.size_;
  segments_00.size_ = (size_t)paVar4;
  writeMessage((capnp *)&local_158,(OutputStream *)AVar5.ptr,segments_00);
  other.size_ = local_178.size_;
  other.ptr = local_178.ptr;
  bVar3 = TestOutputStream::dataEquals(&local_158,other);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-test.c++"
               ,0x178,ERROR,"\"failed: expected \" \"output.dataEquals(serialized.asPtr())\"",
               (char (*) [55])"failed: expected output.dataEquals(serialized.asPtr())");
  }
  TestOutputStream::~TestOutputStream(&local_158);
  sVar2 = local_178.size_;
  pwVar1 = local_178.ptr;
  if (local_178.ptr != (word *)0x0) {
    local_178.ptr = (word *)0x0;
    local_178.size_ = 0;
    (*(code *)**(undefined8 **)local_178.disposer)(local_178.disposer,pwVar1,8,sVar2,sVar2,0);
  }
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)&local_100);
  return;
}

Assistant:

TEST(Orphans, DynamicList) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint32_t>>({12, 34, 56});
  EXPECT_TRUE(root.hasAnyPointerField());

  Orphan<DynamicList> orphan =
      root.getAnyPointerField().disownAs<DynamicList>(Schema::from<List<uint32_t>>());
  EXPECT_FALSE(orphan == nullptr);

  checkList<uint32_t>(orphan.getReader(), {12, 34, 56});
  EXPECT_FALSE(root.hasAnyPointerField());

  root.getAnyPointerField().adopt(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasAnyPointerField());
  checkList(root.asReader().getAnyPointerField().getAs<List<uint32_t>>(), {12u, 34u, 56u});

  Orphan<DynamicList> orphan2 = root.getAnyPointerField().disownAs<List<uint32_t>>();
  EXPECT_FALSE(orphan2 == nullptr);
  checkList<uint32_t>(orphan2.getReader(), {12, 34, 56});
}